

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

bool __thiscall
MODEL3D::three_dim_model::filter_paths
          (three_dim_model *this,Paths *primary_paths,Paths *secondary_paths)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pIVar3;
  bool bVar4;
  int iVar5;
  pointer pvVar6;
  const_iterator __position;
  iterator holes_it;
  pointer pvVar7;
  Path *a;
  cInt local_48;
  cInt cStack_40;
  
  pvVar1 = (primary_paths->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar7 = (primary_paths->
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar1; pvVar7 = pvVar7 + 1) {
    pvVar2 = (primary_paths->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar6 = (primary_paths->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar2; pvVar6 = pvVar6 + 1)
    {
      if (pvVar6 != pvVar7) {
        pIVar3 = (pvVar6->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_48 = pIVar3->X;
        cStack_40 = pIVar3->Y;
        this = (three_dim_model *)&stack0xffffffffffffffb8;
        iVar5 = ClipperLib::PointInPolygon((IntPoint *)&stack0xffffffffffffffb8,pvVar7);
        if (iVar5 == 1) {
          this = (three_dim_model *)secondary_paths;
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(secondary_paths,pvVar6);
        }
      }
    }
  }
  pvVar7 = (secondary_paths->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (secondary_paths->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = pvVar1;
  a = pvVar7;
  if (pvVar7 != pvVar1) {
    for (; a != pvVar6; a = a + 1) {
      pvVar6 = (primary_paths->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__position._M_current =
                (primary_paths->
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; __position._M_current != pvVar6;
          __position._M_current = __position._M_current + 1) {
        bVar4 = clipper_path_is_equal(this,a,__position._M_current);
        if (bVar4) {
          this = (three_dim_model *)primary_paths;
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::erase(primary_paths,__position);
          pvVar6 = (primary_paths->
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          __position._M_current = pvVar6 + -1;
        }
      }
      pvVar6 = (secondary_paths->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return pvVar7 != pvVar1;
}

Assistant:

bool MODEL3D::three_dim_model::filter_paths(
ClipperLib::Paths &primary_paths,
ClipperLib::Paths &secondary_paths)
{
    auto outer_it_end = primary_paths.end();
    for ( auto outer_it = primary_paths.begin();
         outer_it != outer_it_end;
         outer_it++)
    {
        //compare against every other polygon
        auto inner_it_end = primary_paths.end();
        for ( auto inner_it = primary_paths.begin();
             inner_it != inner_it_end;
             inner_it++)
        {
            if(inner_it!=outer_it)
            {
                ClipperLib::IntPoint check;
                // Pick a point of the polygon
                check.X = inner_it->begin()->X;
                check.Y = inner_it->begin()->Y;
                if(ClipperLib::PointInPolygon(check, *outer_it)==1)
                    secondary_paths.push_back(*inner_it);
            }
        }
    }
    // remove the identified paths from the main vector
    if(!secondary_paths.empty())
    {
        for ( auto holes_it = secondary_paths.begin();
        holes_it != secondary_paths.end();
        holes_it++)
        {
            auto main_end = primary_paths.end();
            for ( auto main_it = primary_paths.begin(); main_it != primary_paths.end(); main_it++)
            {
                if(clipper_path_is_equal(*holes_it, *main_it))
                {
                    primary_paths.erase(main_it);
                    //break the loop as this shape was found
                    main_it = std::prev(primary_paths.end(),1);
                }
            }
        }
        return true;
    }
    return false;
}